

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_vector.cpp
# Opt level: O2

bool fill_review(Review *r)

{
  std::operator<<((ostream *)&std::cout,"\nEnter book title (q to quit): ");
}

Assistant:

bool fill_review(Review & r) {
    std::cout << "\nEnter book title (q to quit): ";
    std::getline(std::cin, r.title);
    if (r.title == "q") {
        return false;
    }
    std::cout << "Enter book rating: ";
    std::cin >> r.rating;

    if (!std::cin) {
        return false;
    }
    //  get rid of rest of input line
    while(std::cin.get() != '\n') {
        continue;
    }
    return true;
}